

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_8ca613::HandleDirectoryMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  string *str;
  size_type sVar5;
  ulong uVar6;
  cmGlobalGenerator *this_00;
  undefined1 local_d20 [24];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_d08;
  MessageLevel local_cfc;
  undefined1 local_cf8 [4];
  MessageLevel message;
  cmAlphaNum local_cc8;
  string local_c98;
  string local_c78;
  cmAlphaNum local_c58;
  cmAlphaNum local_c28;
  string local_bf8;
  string local_bd8 [8];
  string destinationStr;
  cmAlphaNum local_b88;
  string local_b58;
  cmAlphaNum local_b38;
  cmAlphaNum local_b08;
  string local_ad8;
  cmAlphaNum local_ab8;
  cmAlphaNum local_a88;
  string local_a58;
  cmAlphaNum local_a38;
  cmAlphaNum local_a08;
  string local_9d8;
  undefined1 local_9b8 [8];
  string regex_1;
  string regex;
  cmAlphaNum local_948;
  string local_918;
  cmAlphaNum local_8f8;
  cmAlphaNum local_8c8;
  string local_898;
  cmAlphaNum local_878;
  cmAlphaNum local_848;
  string local_818;
  size_type local_7f8;
  size_type gpos;
  string dir;
  cmAlphaNum local_7a0;
  string local_770;
  cmAlphaNum local_750;
  cmAlphaNum local_720;
  string local_6f0;
  cmAlphaNum local_6d0;
  cmAlphaNum local_6a0;
  string local_670;
  cmAlphaNum local_650;
  cmAlphaNum local_620;
  string local_5f0;
  cmAlphaNum local_5d0;
  cmAlphaNum local_5a0;
  string local_570;
  cmAlphaNum local_550;
  cmAlphaNum local_520;
  string local_4f0;
  cmAlphaNum local_4d0;
  cmAlphaNum local_4a0;
  string local_470;
  cmAlphaNum local_450;
  cmAlphaNum local_420;
  string local_3f0;
  cmAlphaNum local_3d0;
  cmAlphaNum local_3a0;
  string local_370;
  cmAlphaNum local_350;
  cmAlphaNum local_320;
  string local_2f0;
  cmAlphaNum local_2d0;
  cmAlphaNum local_2a0;
  string local_270;
  cmAlphaNum local_250;
  cmAlphaNum local_220;
  string local_1f0;
  int local_1cc;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  string local_168;
  uint local_144;
  undefined1 local_140 [4];
  uint i;
  string type;
  string literal_args;
  undefined1 local_f0 [8];
  string component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string permissions_dir;
  string permissions_file;
  string *destination;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  bool message_never;
  bool exclude_from_all;
  bool optional;
  bool in_match_mode;
  Doing doing;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)&message_never,status);
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&destination);
  permissions_file.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(permissions_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&component.field_2 + 8));
  std::__cxx11::string::string((string *)local_f0,(string *)&helper.Makefile);
  std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_140);
  for (local_144 = 1; uVar6 = (ulong)local_144,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar6 < sVar3; local_144 = local_144 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_144);
    bVar2 = std::operator==(pvVar4,"DESTINATION");
    uVar1 = helper.DefaultComponentName.field_2._8_8_;
    if (bVar2) {
      if ((dirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmAlphaNum::cmAlphaNum(&local_198,pvVar4);
        cmAlphaNum::cmAlphaNum(&local_1c8," does not allow \"");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_144);
        cmStrCat<std::__cxx11::string,char[26]>
                  (&local_168,&local_198,&local_1c8,pvVar4,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        args_local._7_1_ = 0;
        local_1cc = 1;
        goto LAB_0052db57;
      }
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_144);
      bVar2 = std::operator==(pvVar4,"TYPE");
      uVar1 = helper.DefaultComponentName.field_2._8_8_;
      if (bVar2) {
        if ((dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          cmAlphaNum::cmAlphaNum(&local_220,pvVar4);
          cmAlphaNum::cmAlphaNum(&local_250," does not allow \"");
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_144);
          cmStrCat<std::__cxx11::string,char[26]>
                    (&local_1f0,&local_220,&local_250,pvVar4,
                     (char (*) [26])"\" after PATTERN or REGEX.");
          cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          args_local._7_1_ = 0;
          local_1cc = 1;
          goto LAB_0052db57;
        }
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_144);
        bVar2 = std::operator==(pvVar4,"OPTIONAL");
        uVar1 = helper.DefaultComponentName.field_2._8_8_;
        if (bVar2) {
          if ((dirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,0);
            cmAlphaNum::cmAlphaNum(&local_2a0,pvVar4);
            cmAlphaNum::cmAlphaNum(&local_2d0," does not allow \"");
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_144);
            cmStrCat<std::__cxx11::string,char[26]>
                      (&local_270,&local_2a0,&local_2d0,pvVar4,
                       (char (*) [26])"\" after PATTERN or REGEX.");
            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_270);
            std::__cxx11::string::~string((string *)&local_270);
            args_local._7_1_ = 0;
            local_1cc = 1;
            goto LAB_0052db57;
          }
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_144);
          bVar2 = std::operator==(pvVar4,"MESSAGE_NEVER");
          uVar1 = helper.DefaultComponentName.field_2._8_8_;
          if (bVar2) {
            if ((dirs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,0);
              cmAlphaNum::cmAlphaNum(&local_320,pvVar4);
              cmAlphaNum::cmAlphaNum(&local_350," does not allow \"");
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)local_144);
              cmStrCat<std::__cxx11::string,char[26]>
                        (&local_2f0,&local_320,&local_350,pvVar4,
                         (char (*) [26])"\" after PATTERN or REGEX.");
              cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_2f0);
              std::__cxx11::string::~string((string *)&local_2f0);
              args_local._7_1_ = 0;
              local_1cc = 1;
              goto LAB_0052db57;
            }
            dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
            dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_144);
            bVar2 = std::operator==(pvVar4,"PATTERN");
            if (bVar2) {
              dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
              dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)local_144);
              bVar2 = std::operator==(pvVar4,"REGEX");
              if (bVar2) {
                dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
                dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)local_144);
                bVar2 = std::operator==(pvVar4,"EXCLUDE");
                uVar1 = helper.DefaultComponentName.field_2._8_8_;
                if (bVar2) {
                  if ((((dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) ||
                      (dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 3)) ||
                     (dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 4)) {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,0);
                    cmAlphaNum::cmAlphaNum(&local_3a0,pvVar4);
                    cmAlphaNum::cmAlphaNum(&local_3d0," does not allow \"");
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)local_144);
                    cmStrCat<std::__cxx11::string,char[38]>
                              (&local_370,&local_3a0,&local_3d0,pvVar4,
                               (char (*) [38])"\" before a PATTERN or REGEX is given.");
                    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_370);
                    std::__cxx11::string::~string((string *)&local_370);
                    args_local._7_1_ = 0;
                    local_1cc = 1;
                    goto LAB_0052db57;
                  }
                  std::__cxx11::string::operator+=
                            ((string *)(type.field_2._M_local_buf + 8)," EXCLUDE");
                  dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,(ulong)local_144);
                  bVar2 = std::operator==(pvVar4,"PERMISSIONS");
                  uVar1 = helper.DefaultComponentName.field_2._8_8_;
                  if (bVar2) {
                    if ((dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,0);
                      cmAlphaNum::cmAlphaNum(&local_420,pvVar4);
                      cmAlphaNum::cmAlphaNum(&local_450," does not allow \"");
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)local_144);
                      cmStrCat<std::__cxx11::string,char[38]>
                                (&local_3f0,&local_420,&local_450,pvVar4,
                                 (char (*) [38])"\" before a PATTERN or REGEX is given.");
                      cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_3f0);
                      std::__cxx11::string::~string((string *)&local_3f0);
                      args_local._7_1_ = 0;
                      local_1cc = 1;
                      goto LAB_0052db57;
                    }
                    std::__cxx11::string::operator+=
                              ((string *)(type.field_2._M_local_buf + 8)," PERMISSIONS");
                    dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
                  }
                  else {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)local_144);
                    bVar2 = std::operator==(pvVar4,"FILE_PERMISSIONS");
                    uVar1 = helper.DefaultComponentName.field_2._8_8_;
                    if (bVar2) {
                      if ((dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,0);
                        cmAlphaNum::cmAlphaNum(&local_4a0,pvVar4);
                        cmAlphaNum::cmAlphaNum(&local_4d0," does not allow \"");
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)local_144);
                        cmStrCat<std::__cxx11::string,char[26]>
                                  (&local_470,&local_4a0,&local_4d0,pvVar4,
                                   (char (*) [26])"\" after PATTERN or REGEX.");
                        cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_470);
                        std::__cxx11::string::~string((string *)&local_470);
                        args_local._7_1_ = 0;
                        local_1cc = 1;
                        goto LAB_0052db57;
                      }
                      dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
                    }
                    else {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)local_144);
                      bVar2 = std::operator==(pvVar4,"DIRECTORY_PERMISSIONS");
                      uVar1 = helper.DefaultComponentName.field_2._8_8_;
                      if (bVar2) {
                        if ((dirs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,0);
                          cmAlphaNum::cmAlphaNum(&local_520,pvVar4);
                          cmAlphaNum::cmAlphaNum(&local_550," does not allow \"");
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)local_144);
                          cmStrCat<std::__cxx11::string,char[26]>
                                    (&local_4f0,&local_520,&local_550,pvVar4,
                                     (char (*) [26])"\" after PATTERN or REGEX.");
                          cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_4f0);
                          std::__cxx11::string::~string((string *)&local_4f0);
                          args_local._7_1_ = 0;
                          local_1cc = 1;
                          goto LAB_0052db57;
                        }
                        dirs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 6;
                      }
                      else {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)local_144);
                        bVar2 = std::operator==(pvVar4,"USE_SOURCE_PERMISSIONS");
                        uVar1 = helper.DefaultComponentName.field_2._8_8_;
                        if (bVar2) {
                          if ((dirs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,0);
                            cmAlphaNum::cmAlphaNum(&local_5a0,pvVar4);
                            cmAlphaNum::cmAlphaNum(&local_5d0," does not allow \"");
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)local_144);
                            cmStrCat<std::__cxx11::string,char[26]>
                                      (&local_570,&local_5a0,&local_5d0,pvVar4,
                                       (char (*) [26])"\" after PATTERN or REGEX.");
                            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_570);
                            std::__cxx11::string::~string((string *)&local_570);
                            args_local._7_1_ = 0;
                            local_1cc = 1;
                            goto LAB_0052db57;
                          }
                          std::__cxx11::string::operator+=
                                    ((string *)(type.field_2._M_local_buf + 8),
                                     " USE_SOURCE_PERMISSIONS");
                          dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                        }
                        else {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)local_144);
                          bVar2 = std::operator==(pvVar4,"FILES_MATCHING");
                          uVar1 = helper.DefaultComponentName.field_2._8_8_;
                          if (bVar2) {
                            if ((dirs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0)
                            {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,0);
                              cmAlphaNum::cmAlphaNum(&local_620,pvVar4);
                              cmAlphaNum::cmAlphaNum(&local_650," does not allow \"");
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_144);
                              cmStrCat<std::__cxx11::string,char[26]>
                                        (&local_5f0,&local_620,&local_650,pvVar4,
                                         (char (*) [26])"\" after PATTERN or REGEX.");
                              cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_5f0);
                              std::__cxx11::string::~string((string *)&local_5f0);
                              args_local._7_1_ = 0;
                              local_1cc = 1;
                              goto LAB_0052db57;
                            }
                            std::__cxx11::string::operator+=
                                      ((string *)(type.field_2._M_local_buf + 8)," FILES_MATCHING");
                            dirs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                          }
                          else {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)local_144);
                            bVar2 = std::operator==(pvVar4,"CONFIGURATIONS");
                            uVar1 = helper.DefaultComponentName.field_2._8_8_;
                            if (bVar2) {
                              if ((dirs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) !=
                                  0) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                cmAlphaNum::cmAlphaNum(&local_6a0,pvVar4);
                                cmAlphaNum::cmAlphaNum(&local_6d0," does not allow \"");
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_144);
                                cmStrCat<std::__cxx11::string,char[26]>
                                          (&local_670,&local_6a0,&local_6d0,pvVar4,
                                           (char (*) [26])"\" after PATTERN or REGEX.");
                                cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_670);
                                std::__cxx11::string::~string((string *)&local_670);
                                args_local._7_1_ = 0;
                                local_1cc = 1;
                                goto LAB_0052db57;
                              }
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
                            }
                            else {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_144);
                              bVar2 = std::operator==(pvVar4,"COMPONENT");
                              uVar1 = helper.DefaultComponentName.field_2._8_8_;
                              if (bVar2) {
                                if ((dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1)
                                    != 0) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  cmAlphaNum::cmAlphaNum(&local_720,pvVar4);
                                  cmAlphaNum::cmAlphaNum(&local_750," does not allow \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  cmStrCat<std::__cxx11::string,char[26]>
                                            (&local_6f0,&local_720,&local_750,pvVar4,
                                             (char (*) [26])"\" after PATTERN or REGEX.");
                                  cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_6f0)
                                  ;
                                  std::__cxx11::string::~string((string *)&local_6f0);
                                  args_local._7_1_ = 0;
                                  local_1cc = 1;
                                  goto LAB_0052db57;
                                }
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
                              }
                              else {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_144);
                                bVar2 = std::operator==(pvVar4,"EXCLUDE_FROM_ALL");
                                uVar1 = helper.DefaultComponentName.field_2._8_8_;
                                if (bVar2) {
                                  if ((dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1)
                                      != 0) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_7a0,pvVar4);
                                    cmAlphaNum::cmAlphaNum
                                              ((cmAlphaNum *)((long)&dir.field_2 + 8),
                                               " does not allow \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[26]>
                                              (&local_770,&local_7a0,
                                               (cmAlphaNum *)((long)&dir.field_2 + 8),pvVar4,
                                               (char (*) [26])"\" after PATTERN or REGEX.");
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_770);
                                    std::__cxx11::string::~string((string *)&local_770);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                    goto LAB_0052db57;
                                  }
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         1) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  std::__cxx11::string::string((string *)&gpos,(string *)pvVar4);
                                  local_7f8 = cmGeneratorExpression::Find((string *)&gpos);
                                  if ((local_7f8 != 0) &&
                                     (bVar2 = cmsys::SystemTools::FileIsFullPath((string *)&gpos),
                                     !bVar2)) {
                                    str = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                                                    ((cmMakefile *)helper.Status);
                                    cmAlphaNum::cmAlphaNum(&local_848,str);
                                    cmAlphaNum::cmAlphaNum(&local_878,'/');
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string>
                                              (&local_818,&local_848,&local_878,pvVar4);
                                    std::__cxx11::string::operator=
                                              ((string *)&gpos,(string *)&local_818);
                                    std::__cxx11::string::~string((string *)&local_818);
                                  }
                                  bVar2 = cmsys::SystemTools::FileExists((string *)&gpos);
                                  if ((!bVar2) ||
                                     (bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&gpos),
                                     uVar1 = helper.DefaultComponentName.field_2._8_8_, bVar2)) {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&destination,(value_type *)&gpos);
                                    local_1cc = 0;
                                  }
                                  else {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_8c8,pvVar4);
                                    cmAlphaNum::cmAlphaNum(&local_8f8," given non-directory \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[14]>
                                              (&local_898,&local_8c8,&local_8f8,pvVar4,
                                               (char (*) [14])"\" to install.");
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_898);
                                    std::__cxx11::string::~string((string *)&local_898);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                  }
                                  std::__cxx11::string::~string((string *)&gpos);
                                  if (local_1cc != 0) goto LAB_0052db57;
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         8) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)((long)&component.field_2 + 8),pvVar4);
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         2) {
                                  permissions_file.field_2._8_8_ =
                                       std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_144);
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         10) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  sVar5 = std::
                                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::count((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)(anonymous_namespace)::allowedTypes_abi_cxx11_,
                                                  pvVar4);
                                  uVar1 = helper.DefaultComponentName.field_2._8_8_;
                                  if (sVar5 == 0) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_948,pvVar4);
                                    cmAlphaNum::cmAlphaNum
                                              ((cmAlphaNum *)((long)&regex.field_2 + 8),
                                               " given non-type \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[22]>
                                              (&local_918,&local_948,
                                               (cmAlphaNum *)((long)&regex.field_2 + 8),pvVar4,
                                               (char (*) [22])"\" with TYPE argument.");
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_918);
                                    std::__cxx11::string::~string((string *)&local_918);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                    goto LAB_0052db57;
                                  }
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  std::__cxx11::string::operator=
                                            ((string *)local_140,(string *)pvVar4);
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         3) {
                                  std::__cxx11::string::operator+=
                                            ((string *)(type.field_2._M_local_buf + 8)," REGEX \"/")
                                  ;
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  cmsys::Glob::PatternToRegex
                                            ((string *)((long)&regex_1.field_2 + 8),pvVar4,false,
                                             false);
                                  cmsys::SystemTools::ReplaceString
                                            ((string *)((long)&regex_1.field_2 + 8),"\\","\\\\");
                                  std::__cxx11::string::operator+=
                                            ((string *)(type.field_2._M_local_buf + 8),
                                             (string *)(regex_1.field_2._M_local_buf + 8));
                                  std::__cxx11::string::operator+=
                                            ((string *)(type.field_2._M_local_buf + 8),"$\"");
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                  std::__cxx11::string::~string
                                            ((string *)(regex_1.field_2._M_local_buf + 8));
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         4) {
                                  std::__cxx11::string::operator+=
                                            ((string *)(type.field_2._M_local_buf + 8)," REGEX \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  std::__cxx11::string::string((string *)local_9b8,(string *)pvVar4)
                                  ;
                                  cmsys::SystemTools::ReplaceString((string *)local_9b8,"\\","\\\\")
                                  ;
                                  std::__cxx11::string::operator+=
                                            ((string *)(type.field_2._M_local_buf + 8),
                                             (string *)local_9b8);
                                  std::__cxx11::string::operator+=
                                            ((string *)(type.field_2._M_local_buf + 8),"\"");
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                  std::__cxx11::string::~string((string *)local_9b8);
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         9) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  std::__cxx11::string::operator=
                                            ((string *)local_f0,(string *)pvVar4);
                                  dirs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         5) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  bVar2 = cmInstallCommandArguments::CheckPermissions
                                                    (pvVar4,(string *)
                                                            ((long)&permissions_dir.field_2 + 8));
                                  uVar1 = helper.DefaultComponentName.field_2._8_8_;
                                  if (!bVar2) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_a08,pvVar4);
                                    cmAlphaNum::cmAlphaNum
                                              (&local_a38," given invalid file permission \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[3]>
                                              (&local_9d8,&local_a08,&local_a38,pvVar4,
                                               (char (*) [3])0xc51f8d);
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_9d8);
                                    std::__cxx11::string::~string((string *)&local_9d8);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                    goto LAB_0052db57;
                                  }
                                }
                                else if (dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                                         6) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  bVar2 = cmInstallCommandArguments::CheckPermissions
                                                    (pvVar4,(string *)
                                                            &configurations.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  uVar1 = helper.DefaultComponentName.field_2._8_8_;
                                  if (!bVar2) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_a88,pvVar4);
                                    cmAlphaNum::cmAlphaNum
                                              (&local_ab8," given invalid directory permission \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[3]>
                                              (&local_a58,&local_a88,&local_ab8,pvVar4,
                                               (char (*) [3])0xc51f8d);
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_a58);
                                    std::__cxx11::string::~string((string *)&local_a58);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                    goto LAB_0052db57;
                                  }
                                }
                                else {
                                  if (dirs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 7)
                                  {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_b88,pvVar4);
                                    cmAlphaNum::cmAlphaNum
                                              ((cmAlphaNum *)((long)&destinationStr.field_2 + 8),
                                               " given unknown argument \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[3]>
                                              (&local_b58,&local_b88,
                                               (cmAlphaNum *)((long)&destinationStr.field_2 + 8),
                                               pvVar4,(char (*) [3])0xc51f8d);
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_b58);
                                    std::__cxx11::string::~string((string *)&local_b58);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                    goto LAB_0052db57;
                                  }
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_144);
                                  bVar2 = cmInstallCommandArguments::CheckPermissions
                                                    (pvVar4,(string *)((long)&type.field_2 + 8));
                                  uVar1 = helper.DefaultComponentName.field_2._8_8_;
                                  if (!bVar2) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,0);
                                    cmAlphaNum::cmAlphaNum(&local_b08,pvVar4);
                                    cmAlphaNum::cmAlphaNum
                                              (&local_b38," given invalid permission \"");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_144);
                                    cmStrCat<std::__cxx11::string,char[3]>
                                              (&local_ad8,&local_b08,&local_b38,pvVar4,
                                               (char (*) [3])0xc51f8d);
                                    cmExecutionStatus::SetError
                                              ((cmExecutionStatus *)uVar1,&local_ad8);
                                    std::__cxx11::string::~string((string *)&local_ad8);
                                    args_local._7_1_ = 0;
                                    local_1cc = 1;
                                    goto LAB_0052db57;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&destination);
  if ((bVar2) && (permissions_file.field_2._8_8_ != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&destination);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&destination);
  if (bVar2) {
    args_local._7_1_ = 1;
    local_1cc = 1;
    goto LAB_0052db57;
  }
  std::__cxx11::string::string(local_bd8);
  if (permissions_file.field_2._8_8_ == 0) {
    uVar6 = std::__cxx11::string::empty();
    uVar1 = helper.DefaultComponentName.field_2._8_8_;
    if ((uVar6 & 1) == 0) {
      Helper::GetDestinationForType
                (&local_c78,(Helper *)&message_never,(cmInstallCommandArguments *)0x0,
                 (string *)local_140);
      std::__cxx11::string::operator=(local_bd8,(string *)&local_c78);
      std::__cxx11::string::~string((string *)&local_c78);
      permissions_file.field_2._8_8_ = local_bd8;
LAB_0052d9b1:
      local_cfc = cmInstallGenerator::SelectMessageLevel
                            ((cmMakefile *)helper.Status,
                             (bool)((byte)dirs.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 1));
      this = helper.Status;
      cmMakefile::GetBacktrace((cmMakefile *)local_d20);
      std::
      make_unique<cmInstallDirectoryGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,cmInstallGenerator::MessageLevel&,bool&,std::__cxx11::string&,bool&,cmListFileBacktrace>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_d20 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&destination,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 permissions_file.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&permissions_dir.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&component.field_2 + 8),(MessageLevel *)local_f0,(bool *)&local_cfc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                 (bool *)(type.field_2._M_local_buf + 8),
                 (cmListFileBacktrace *)
                 ((long)&dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
      unique_ptr<cmInstallDirectoryGenerator,std::default_delete<cmInstallDirectoryGenerator>,void>
                ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                 &local_d08,
                 (unique_ptr<cmInstallDirectoryGenerator,_std::default_delete<cmInstallDirectoryGenerator>_>
                  *)(local_d20 + 0x10));
      cmMakefile::AddInstallGenerator((cmMakefile *)this,&local_d08);
      std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::~unique_ptr
                (&local_d08);
      std::
      unique_ptr<cmInstallDirectoryGenerator,_std::default_delete<cmInstallDirectoryGenerator>_>::
      ~unique_ptr((unique_ptr<cmInstallDirectoryGenerator,_std::default_delete<cmInstallDirectoryGenerator>_>
                   *)(local_d20 + 0x10));
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_d20);
      this_00 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
      cmGlobalGenerator::AddInstallComponent(this_00,(string *)local_f0);
      args_local._7_1_ = 1;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      cmAlphaNum::cmAlphaNum(&local_c28,pvVar4);
      cmAlphaNum::cmAlphaNum(&local_c58," given no DESTINATION!");
      cmStrCat<>(&local_bf8,&local_c28,&local_c58);
      cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_bf8);
      std::__cxx11::string::~string((string *)&local_bf8);
      args_local._7_1_ = 0;
    }
  }
  else {
    uVar6 = std::__cxx11::string::empty();
    uVar1 = helper.DefaultComponentName.field_2._8_8_;
    if ((uVar6 & 1) != 0) goto LAB_0052d9b1;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_cc8,pvVar4);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)local_cf8,
               " given both TYPE and DESTINATION arguments. You may only specify one.");
    cmStrCat<>(&local_c98,&local_cc8,(cmAlphaNum *)local_cf8);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_c98);
    std::__cxx11::string::~string((string *)&local_c98);
    args_local._7_1_ = 0;
  }
  local_1cc = 1;
  std::__cxx11::string::~string(local_bd8);
LAB_0052db57:
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&component.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(permissions_dir.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&destination);
  Helper::~Helper((Helper *)&message_never);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleDirectoryMode(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  Helper helper(status);

  enum Doing
  {
    DoingNone,
    DoingDirs,
    DoingDestination,
    DoingPattern,
    DoingRegex,
    DoingPermsFile,
    DoingPermsDir,
    DoingPermsMatch,
    DoingConfigurations,
    DoingComponent,
    DoingType
  };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool exclude_from_all = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const std::string* destination = nullptr;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = helper.DefaultComponentName;
  std::string literal_args;
  std::string type;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "DESTINATION") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the destination property.
      doing = DoingDestination;
    } else if (args[i] == "TYPE") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the type.
      doing = DoingType;
    } else if (args[i] == "OPTIONAL") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
    } else if (args[i] == "MESSAGE_NEVER") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
    } else if (args[i] == "PATTERN") {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
    } else if (args[i] == "REGEX") {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
    } else if (args[i] == "EXCLUDE") {
      // Add this property to the current match rule.
      if (!in_match_mode || doing == DoingPattern || doing == DoingRegex) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" before a PATTERN or REGEX is given."));
        return false;
      }
      literal_args += " EXCLUDE";
      doing = DoingNone;
    } else if (args[i] == "PERMISSIONS") {
      if (!in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" before a PATTERN or REGEX is given."));
        return false;
      }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
    } else if (args[i] == "DIRECTORY_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
    } else if (args[i] == "FILES_MATCHING") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
    } else if (args[i] == "CONFIGURATIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
    } else if (args[i] == "COMPONENT") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the component property.
      doing = DoingComponent;
    } else if (args[i] == "EXCLUDE_FROM_ALL") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }
      exclude_from_all = true;
      doing = DoingNone;
    } else if (doing == DoingDirs) {
      // Convert this directory to a full path.
      std::string dir = args[i];
      std::string::size_type gpos = cmGeneratorExpression::Find(dir);
      if (gpos != 0 && !cmSystemTools::FileIsFullPath(dir)) {
        dir =
          cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', args[i]);
      }

      // Make sure the name is a directory.
      if (cmSystemTools::FileExists(dir) &&
          !cmSystemTools::FileIsDirectory(dir)) {
        status.SetError(cmStrCat(args[0], " given non-directory \"", args[i],
                                 "\" to install."));
        return false;
      }

      // Store the directory for installation.
      dirs.push_back(std::move(dir));
    } else if (doing == DoingConfigurations) {
      configurations.push_back(args[i]);
    } else if (doing == DoingDestination) {
      destination = &args[i];
      doing = DoingNone;
    } else if (doing == DoingType) {
      if (allowedTypes.count(args[i]) == 0) {
        status.SetError(cmStrCat(args[0], " given non-type \"", args[i],
                                 "\" with TYPE argument."));
        return false;
      }

      type = args[i];
      doing = DoingNone;
    } else if (doing == DoingPattern) {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
    } else if (doing == DoingRegex) {
      literal_args += " REGEX \"";
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
    } else if (doing == DoingComponent) {
      component = args[i];
      doing = DoingNone;
    } else if (doing == DoingPermsFile) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_file)) {
        status.SetError(cmStrCat(args[0], " given invalid file permission \"",
                                 args[i], "\"."));
        return false;
      }
    } else if (doing == DoingPermsDir) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_dir)) {
        status.SetError(cmStrCat(
          args[0], " given invalid directory permission \"", args[i], "\"."));
        return false;
      }
    } else if (doing == DoingPermsMatch) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       literal_args)) {
        status.SetError(
          cmStrCat(args[0], " given invalid permission \"", args[i], "\"."));
        return false;
      }
    } else {
      // Unknown argument.
      status.SetError(
        cmStrCat(args[0], " given unknown argument \"", args[i], "\"."));
      return false;
    }
  }

  // Support installing an empty directory.
  if (dirs.empty() && destination) {
    dirs.emplace_back();
  }

  // Check if there is something to do.
  if (dirs.empty()) {
    return true;
  }
  std::string destinationStr;
  if (!destination) {
    if (type.empty()) {
      // A destination is required.
      status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
      return false;
    }
    destinationStr = helper.GetDestinationForType(nullptr, type);
    destination = &destinationStr;
  } else if (!type.empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION "
                             "arguments. You may only specify one."));
    return false;
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile, message_never);

  // Create the directory install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallDirectoryGenerator>(
      dirs, *destination, permissions_file, permissions_dir, configurations,
      component, message, exclude_from_all, literal_args, optional,
      helper.Makefile->GetBacktrace()));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}